

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::LowerOneBailOutKind
          (Lowerer *this,Instr *instr,BailOutKind bailOutKindToLower,bool isInHelperBlock,
          bool preserveBailOutKindInInstr)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  BailOutInfo *pBVar7;
  BailOutInstrTemplate<IR::Instr> *this_00;
  BailOutKind local_60;
  BailOutInstr *bailOutInstr;
  Instr *insertBeforeInstr;
  Instr *sharedBail;
  BailOutInfo *pBStack_30;
  BailOutKind bailOutKind;
  BailOutInfo *bailOutInfo;
  Func *func;
  bool preserveBailOutKindInInstr_local;
  bool isInHelperBlock_local;
  Instr *pIStack_18;
  BailOutKind bailOutKindToLower_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  func._2_1_ = preserveBailOutKindInInstr;
  func._3_1_ = isInHelperBlock;
  func._4_4_ = bailOutKindToLower;
  pIStack_18 = instr;
  instr_local = (Instr *)this;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3347,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IR::operator!(func._4_4_);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3348,"(bailOutKindToLower)","bailOutKindToLower");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  BVar3 = IR::operator&(func._4_4_,BailOutKindBits);
  bVar2 = IR::operator!(BVar3);
  BVar3 = func._4_4_;
  if (!bVar2) {
    BVar4 = IR::operator-(func._4_4_,1);
    BVar3 = IR::operator&(BVar3,BVar4);
    bVar2 = IR::operator!(BVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3349,
                         "(!(bailOutKindToLower & IR::BailOutKindBits) || !(bailOutKindToLower & bailOutKindToLower - 1u))"
                         ,
                         "!(bailOutKindToLower & IR::BailOutKindBits) || !(bailOutKindToLower & bailOutKindToLower - 1u)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  bailOutInfo = (BailOutInfo *)pIStack_18->m_func;
  pBStack_30 = IR::Instr::GetBailOutInfo(pIStack_18);
  sharedBail._4_4_ = IR::Instr::GetBailOutKind(pIStack_18);
  BVar4 = IR::operator&(func._4_4_,BailOutKindBits);
  BVar3 = sharedBail._4_4_;
  if (BVar4 == BailOutInvalid) {
    BVar4 = IR::operator~(BailOutKindBits);
    BVar3 = IR::operator&(BVar3,BVar4);
    local_60 = (BailOutKind)(BVar3 == func._4_4_);
  }
  else {
    local_60 = IR::operator&(sharedBail._4_4_,func._4_4_);
  }
  if (local_60 == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3353,
                       "(bailOutKindToLower & IR::BailOutKindBits ? bailOutKind & bailOutKindToLower : (bailOutKind & ~IR::BailOutKindBits) == bailOutKindToLower)"
                       ,
                       "bailOutKindToLower & IR::BailOutKindBits ? bailOutKind & bailOutKindToLower : (bailOutKind & ~IR::BailOutKindBits) == bailOutKindToLower"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((func._2_1_ & 1) == 0) {
    IR::operator-=((BailOutKind *)((long)&sharedBail + 4),func._4_4_);
  }
  if (sharedBail._4_4_ == BailOutInvalid) {
    IR::Instr::UnlinkBailOutInfo(pIStack_18);
    if (pBStack_30->bailOutInstr == pIStack_18) {
      pBStack_30->bailOutInstr = (Instr *)0x0;
    }
  }
  else {
    if (pBStack_30->bailOutInstr == pIStack_18) {
      pIVar6 = IR::Instr::ShareBailOut(pIStack_18);
      pBVar7 = IR::Instr::GetBailOutInfo(pIVar6);
      if (pBVar7 != pBStack_30) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x335e,"(sharedBail->GetBailOutInfo() == bailOutInfo)",
                           "sharedBail->GetBailOutInfo() == bailOutInfo");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      GenerateBailOut(this,pIVar6,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    }
    IR::Instr::SetBailOutKind(pIStack_18,sharedBail._4_4_);
  }
  pIVar6 = pIStack_18->m_next;
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOut,func._4_4_,pBStack_30,(Func *)bailOutInfo);
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,pIStack_18);
  IR::Instr::InsertBefore(pIVar6,&this_00->super_Instr);
  GenerateBailOut(this,&this_00->super_Instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0)
  ;
  return;
}

Assistant:

void Lowerer::LowerOneBailOutKind(
    IR::Instr *const instr,
    const IR::BailOutKind bailOutKindToLower,
    const bool isInHelperBlock,
    const bool preserveBailOutKindInInstr)
{
    Assert(instr);
    Assert(bailOutKindToLower);
    Assert(!(bailOutKindToLower & IR::BailOutKindBits) || !(bailOutKindToLower & bailOutKindToLower - 1u));

    Func *const func = instr->m_func;

    // Split bailouts other than the one being lowered here
    BailOutInfo *const bailOutInfo = instr->GetBailOutInfo();
    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    Assert(
        bailOutKindToLower & IR::BailOutKindBits
            ? bailOutKind & bailOutKindToLower
            : (bailOutKind & ~IR::BailOutKindBits) == bailOutKindToLower);
    if(!preserveBailOutKindInInstr)
    {
        bailOutKind -= bailOutKindToLower;
    }
    if(bailOutKind)
    {
        if(bailOutInfo->bailOutInstr == instr)
        {
            // Create a shared bailout point for the split bailout checks
            IR::Instr *const sharedBail = instr->ShareBailOut();
            Assert(sharedBail->GetBailOutInfo() == bailOutInfo);
            GenerateBailOut(sharedBail);
        }
        instr->SetBailOutKind(bailOutKind);
    }
    else
    {
        instr->UnlinkBailOutInfo();
        if(bailOutInfo->bailOutInstr == instr)
        {
            bailOutInfo->bailOutInstr = nullptr;
        }
    }

    IR::Instr *const insertBeforeInstr = instr->m_next;

    //     (Bail out with the requested bail out kind)
    IR::BailOutInstr *const bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOut, bailOutKindToLower, bailOutInfo, func);
    bailOutInstr->SetByteCodeOffset(instr);
    insertBeforeInstr->InsertBefore(bailOutInstr);
    GenerateBailOut(bailOutInstr);

    // The caller is expected to generate code to decide whether to bail out
}